

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

void __thiscall unodb::qsbr_per_thread::qsbr_per_thread(qsbr_per_thread *this)

{
  qsbr_epoch qVar1;
  qsbr *this_00;
  qsbr_per_thread *this_local;
  
  std::make_unique<unodb::detail::dealloc_vector_list_node>();
  std::make_unique<unodb::detail::dealloc_vector_list_node>();
  this->quiescent_states_since_epoch_change = 0;
  this_00 = qsbr::instance();
  qVar1 = qsbr::register_thread(this_00);
  (this->last_seen_quiescent_state_epoch).epoch_val = qVar1.epoch_val;
  (this->last_seen_epoch).epoch_val = (this->last_seen_quiescent_state_epoch).epoch_val;
  std::
  vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ::vector(&this->previous_interval_dealloc_requests);
  std::
  vector<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ::vector(&this->current_interval_dealloc_requests);
  this->paused = false;
  this->current_interval_total_dealloc_size = 0;
  std::
  unordered_multiset<const_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  ::unordered_multiset(&this->active_ptrs);
  return;
}

Assistant:

inline qsbr_per_thread::qsbr_per_thread()
    : last_seen_quiescent_state_epoch{qsbr::instance().register_thread()},
      last_seen_epoch{last_seen_quiescent_state_epoch} {}